

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flood.cpp
# Opt level: O2

void __thiscall
vera::Flood::allocate
          (Flood *this,int _width,int _height,FboType _type,TextureFilter _filter,TextureWrap _wrap,
          bool _autoclear)

{
  ulong uVar1;
  long lVar2;
  int __x;
  __type_conflict __x_00;
  double dVar3;
  
  __x = _height;
  if (_height < _width) {
    __x = _width;
  }
  __x_00 = std::log2<int>(__x);
  dVar3 = ceil(__x_00);
  uVar1 = (ulong)(dVar3 + 1.0);
  this->m_interations = (long)((dVar3 + 1.0) - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1;
  for (lVar2 = 0x18; lVar2 != 0x88; lVar2 = lVar2 + 0x38) {
    (**(code **)(*(long *)((long)&(this->super_PingPong)._vptr_PingPong + lVar2) + 0x10))
              ((long)&(this->super_PingPong)._vptr_PingPong + lVar2,_width,_height,_type,_filter,
               _wrap,_autoclear);
  }
  (*(this->super_PingPong)._vptr_PingPong[4])(0,this);
  (this->super_PingPong).m_flag = 0;
  (*(this->super_PingPong)._vptr_PingPong[3])(this);
  return;
}

Assistant:

void Flood::allocate(int _width, int _height, FboType _type, TextureFilter _filter, TextureWrap _wrap, bool _autoclear) {
    // Set number of iterations based on the resolution
    m_interations = ceil(log2(std::max(_width, _height)) / log2(2.0)) + 1;

    // Allocate the FBOs
    for(int i = 0; i < 2; i++)
        m_fbos[i].allocate(_width, _height, _type, _filter, _wrap, _autoclear);

    // Clean the FBOs
    clear();

    // Set everything to 0
    m_flag = 0;
    swap();
}